

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmLinkImplementation * __thiscall
cmGeneratorTarget::GetLinkImplementation
          (cmGeneratorTarget *this,string *config,LinkInterfaceFor implFor,bool secondPass)

{
  bool bVar1;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
  *this_00;
  cmLinkImplementation *this_01;
  cmLinkImplementation local_d8;
  
  bVar1 = CanCompileSources(this);
  if (bVar1) {
    if (implFor == Usage) {
      this_00 = &GetHeadToLinkImplementationUsageRequirementsMap(this,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
      ;
    }
    else {
      this_00 = &GetHeadToLinkImplementationMap(this,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
      ;
    }
    local_d8.super_cmLinkImplementationLibraries.Libraries.
    super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    this_01 = &std::
               map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
               ::operator[](this_00,(key_type *)&local_d8)->super_cmLinkImplementation;
    if (secondPass) {
      memset(&local_d8,0,0xa8);
      local_d8.LanguageRuntimeLibraries._M_h._M_bucket_count = 1;
      local_d8.LanguageRuntimeLibraries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_d8.LanguageRuntimeLibraries._M_h._M_element_count = 0;
      local_d8.LanguageRuntimeLibraries._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_d8.LanguageRuntimeLibraries._M_h._M_rehash_policy._M_next_resize = 0;
      local_d8.LanguageRuntimeLibraries._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_d8.HadLinkLanguageSensitiveCondition = false;
      local_d8._161_3_ = 0;
      local_d8.LanguageRuntimeLibraries._M_h._M_buckets =
           &local_d8.LanguageRuntimeLibraries._M_h._M_single_bucket;
      cmOptionalLinkImplementation::operator=
                ((cmOptionalLinkImplementation *)this_01,(cmOptionalLinkImplementation *)&local_d8);
      cmLinkImplementation::~cmLinkImplementation(&local_d8);
    }
    if (this_01->field_0xa1 == '\0') {
      this_01->field_0xa1 = 1;
      ComputeLinkImplementationLibraries
                (this,config,(cmOptionalLinkImplementation *)this_01,this,implFor);
    }
    if (this_01->field_0xa2 == '\0') {
      this_01->field_0xa2 = 1;
      ComputeLinkImplementationLanguages(this,config,(cmOptionalLinkImplementation *)this_01);
      ComputeLinkImplementationRuntimeLibraries(this,config,(cmOptionalLinkImplementation *)this_01)
      ;
    }
  }
  else {
    this_01 = (cmLinkImplementation *)0x0;
  }
  return this_01;
}

Assistant:

const cmLinkImplementation* cmGeneratorTarget::GetLinkImplementation(
  const std::string& config, LinkInterfaceFor implFor, bool secondPass) const
{
  // There is no link implementation for targets that cannot compile sources.
  if (!this->CanCompileSources()) {
    return nullptr;
  }

  HeadToLinkImplementationMap& hm =
    (implFor == LinkInterfaceFor::Usage
       ? this->GetHeadToLinkImplementationUsageRequirementsMap(config)
       : this->GetHeadToLinkImplementationMap(config));
  cmOptionalLinkImplementation& impl = hm[this];
  if (secondPass) {
    impl = cmOptionalLinkImplementation();
  }
  if (!impl.LibrariesDone) {
    impl.LibrariesDone = true;
    this->ComputeLinkImplementationLibraries(config, impl, this, implFor);
  }
  if (!impl.LanguagesDone) {
    impl.LanguagesDone = true;
    this->ComputeLinkImplementationLanguages(config, impl);
    this->ComputeLinkImplementationRuntimeLibraries(config, impl);
  }
  return &impl;
}